

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenArrayCopySetDestIndex(BinaryenExpressionRef expr,BinaryenExpressionRef destIndexExpr)

{
  if (expr->_id != ArrayCopyId) {
    __assert_fail("expression->is<ArrayCopy>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x1167,
                  "void BinaryenArrayCopySetDestIndex(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (destIndexExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)destIndexExpr;
    return;
  }
  __assert_fail("destIndexExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x1168,
                "void BinaryenArrayCopySetDestIndex(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenArrayCopySetDestIndex(BinaryenExpressionRef expr,
                                   BinaryenExpressionRef destIndexExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<ArrayCopy>());
  assert(destIndexExpr);
  static_cast<ArrayCopy*>(expression)->destIndex = (Expression*)destIndexExpr;
}